

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

shared_ptr<CLI::ConfigBase> __thiscall CLI::App::get_config_formatter_base(App *this)

{
  pointer pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  long in_RSI;
  undefined1 auVar2 [16];
  shared_ptr<CLI::ConfigBase> sVar3;
  
  if (*(long *)(in_RSI + 0x350) != 0) {
    auVar2 = __dynamic_cast(*(long *)(in_RSI + 0x350),&Config::typeinfo,&ConfigBase::typeinfo,0);
    in_RDX._M_pi = auVar2._8_8_;
    if (auVar2._0_8_ != (_func_int **)0x0) {
      this->_vptr_App = auVar2._0_8_;
      pcVar1 = *(pointer *)(in_RSI + 0x358);
      (this->name_)._M_dataplus._M_p = pcVar1;
      if (pcVar1 != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(pcVar1 + 8) = *(int *)(pcVar1 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(pcVar1 + 8) = *(int *)(pcVar1 + 8) + 1;
        }
      }
      goto LAB_0027e5c8;
    }
  }
  this->_vptr_App = (_func_int **)0x0;
  (this->name_)._M_dataplus._M_p = (pointer)0x0;
LAB_0027e5c8:
  sVar3.super___shared_ptr<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar3.super___shared_ptr<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<CLI::ConfigBase>)
         sVar3.super___shared_ptr<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CLI11_NODISCARD std::shared_ptr<ConfigBase> get_config_formatter_base() const {
        // This is safer as a dynamic_cast if we have RTTI, as Config -> ConfigBase
#if CLI11_USE_STATIC_RTTI == 0
        return std::dynamic_pointer_cast<ConfigBase>(config_formatter_);
#else
        return std::static_pointer_cast<ConfigBase>(config_formatter_);
#endif
    }